

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
boost::ext::ut::v1_1_8::utility::string_view::operator_cast_to_string(string_view *this)

{
  size_type *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  size_type __n;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  __n = *in_RSI;
  __s = (char *)in_RSI[1];
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffef;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,__s,__n,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  return in_RDI;
}

Assistant:

[[nodiscard]] constexpr operator T() const {
      return T{data_, size_};
    }